

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::Parameters::g_squared_l2norm(Parameters *this,float *sqnorm)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int iVar18;
  float fVar19;
  scalar_sum_op<float,_float> local_49;
  float *local_48;
  ulong local_40;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_28;
  
  local_48 = (this->g).v;
  uVar8 = (ulong)(this->g).d.nd;
  if (uVar8 == 0) {
    iVar18 = 1;
  }
  else {
    auVar12 = vpbroadcastq_avx512f();
    auVar13 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar13,auVar14);
      auVar13 = vporq_avx512f(auVar13,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar13,auVar12,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar17,auVar12,2);
      bVar6 = (byte)uVar4;
      uVar10 = CONCAT11(bVar6,bVar5);
      auVar13 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->g).d.d + uVar9));
      auVar17._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar13._4_4_;
      auVar17._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_;
      auVar17._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar13._8_4_;
      auVar17._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar13._12_4_;
      auVar17._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar13._16_4_;
      auVar17._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar13._20_4_;
      auVar17._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar13._24_4_;
      auVar17._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar13._28_4_;
      auVar17._32_4_ = (uint)(bVar6 & 1) * auVar13._32_4_;
      auVar17._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar13._36_4_;
      auVar17._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar13._40_4_;
      auVar17._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar13._44_4_;
      auVar17._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar13._48_4_;
      auVar17._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar13._52_4_;
      auVar17._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar13._56_4_;
      auVar17._60_4_ = (uint)(bVar6 >> 7) * auVar13._60_4_;
      auVar13 = vpmulld_avx512f(auVar17,auVar16);
      uVar9 = uVar9 + 0x10;
    } while ((uVar8 + 0xf & 0xfffffffffffffff0) != uVar9);
    auVar12 = vmovdqa32_avx512f(auVar13);
    auVar13._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar16._0_4_;
    bVar1 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar13._4_4_ = (uint)bVar1 * auVar12._4_4_ | (uint)!bVar1 * auVar16._4_4_;
    bVar1 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar13._8_4_ = (uint)bVar1 * auVar12._8_4_ | (uint)!bVar1 * auVar16._8_4_;
    bVar1 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar13._12_4_ = (uint)bVar1 * auVar12._12_4_ | (uint)!bVar1 * auVar16._12_4_;
    bVar1 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar13._16_4_ = (uint)bVar1 * auVar12._16_4_ | (uint)!bVar1 * auVar16._16_4_;
    bVar1 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar13._20_4_ = (uint)bVar1 * auVar12._20_4_ | (uint)!bVar1 * auVar16._20_4_;
    bVar1 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar13._24_4_ = (uint)bVar1 * auVar12._24_4_ | (uint)!bVar1 * auVar16._24_4_;
    bVar1 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar13._28_4_ = (uint)bVar1 * auVar12._28_4_ | (uint)!bVar1 * auVar16._28_4_;
    auVar13._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar13._36_4_ = (uint)bVar1 * auVar12._36_4_ | (uint)!bVar1 * auVar16._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar13._40_4_ = (uint)bVar1 * auVar12._40_4_ | (uint)!bVar1 * auVar16._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar13._44_4_ = (uint)bVar1 * auVar12._44_4_ | (uint)!bVar1 * auVar16._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar13._48_4_ = (uint)bVar1 * auVar12._48_4_ | (uint)!bVar1 * auVar16._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar13._52_4_ = (uint)bVar1 * auVar12._52_4_ | (uint)!bVar1 * auVar16._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar13._56_4_ = (uint)bVar1 * auVar12._56_4_ | (uint)!bVar1 * auVar16._56_4_;
    auVar13._60_4_ =
         (uint)(bVar6 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar16._60_4_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpmulld_avx512f(auVar13,ZEXT3264(auVar11));
    auVar2 = vpmulld_avx(auVar12._0_16_,auVar12._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar18 = auVar2._0_4_;
  }
  uVar7 = iVar18 * (this->g).d.bd;
  local_40 = (ulong)uVar7;
  if (uVar7 == 0) {
    fVar19 = 0.0;
  }
  else {
    local_28.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
    .m_d.argImpl.
    super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_data = local_48;
    local_28.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
    .m_d.argImpl.
    super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = local_40;
    fVar19 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                       (&local_28,&local_49,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)&local_48);
  }
  *sqnorm = fVar19;
  return;
}

Assistant:

void Parameters::g_squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  gpu::l2_norm_reducer(g.d.size(), g.v, sqnorm, true, false);
#else
  *sqnorm = g.vec().squaredNorm();
#endif
}